

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

void __thiscall
dap::ResponseOrError<dap::VariablesResponse>::~ResponseOrError
          (ResponseOrError<dap::VariablesResponse> *this)

{
  ResponseOrError<dap::VariablesResponse> *this_local;
  
  Error::~Error(&this->error);
  VariablesResponse::~VariablesResponse(&this->response);
  return;
}

Assistant:

inline ResponseOrError() = default;